

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t after)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t iparent;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  char msg [29];
  char local_78 [88];
  undefined2 local_20;
  
  bVar10 = 0;
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_78 + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(local_78,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6530) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x6530) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x1d,LVar2,(this->m_callbacks).m_user_data);
  }
  if (node == after) {
    builtin_strncpy(local_78 + 0x10,"ode != after)",0xe);
    builtin_strncpy(local_78,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6531) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6531) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x1e,LVar3,(this->m_callbacks).m_user_data);
  }
  bVar6 = is_root(this,node);
  if (bVar6) {
    builtin_strncpy(local_78 + 0x10," is_root(node))",0x10);
    builtin_strncpy(local_78,"check failed: (!",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6532) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6532) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x20,LVar4,(this->m_callbacks).m_user_data);
  }
  if (after != 0xffffffffffffffff) {
    bVar6 = has_sibling(this,node,after);
    if (bVar6) {
      bVar6 = has_sibling(this,after,node);
      if (bVar6) goto LAB_002059d1;
    }
    pcVar8 = 
    "check failed: ((after == NONE) || (has_sibling(node, after) && has_sibling(after, node)))";
    pcVar9 = local_78;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 8;
      pcVar9 = pcVar9 + ((ulong)bVar10 * -2 + 1) * 8;
    }
    local_20 = 0x29;
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6533) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6533) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x5a,LVar5,(this->m_callbacks).m_user_data);
  }
LAB_002059d1:
  _rem_hierarchy(this,node);
  iparent = parent(this,node);
  _set_hierarchy(this,node,iparent,after);
  return;
}

Assistant:

void Tree::move(size_t node, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));
    _RYML_CB_ASSERT(m_callbacks, (after == NONE) || (has_sibling(node, after) && has_sibling(after, node)));

    _rem_hierarchy(node);
    _set_hierarchy(node, parent(node), after);
}